

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O3

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  int iVar2;
  uint8_t uVar3;
  ushort uVar4;
  long lVar5;
  undefined7 in_register_00000031;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bitset_container_t *container;
  bitset_container_t *bc;
  
  container = (bitset_container_t *)c;
  uVar3 = typecode;
  if ((int)CONCAT71(in_register_00000031,typecode) == 4) {
    uVar3 = *(uint8_t *)((long)c + 8);
    container = *c;
  }
  if (uVar3 == '\x03') {
    lVar5 = (long)container->cardinality;
    if (lVar5 == 0) {
LAB_0010dd9f:
      uVar4 = 0;
    }
    else {
      uVar4 = *(short *)((long)container->words + lVar5 * 4 + -2) +
              *(short *)((long)container->words + lVar5 * 4 + -4);
    }
  }
  else if (uVar3 == '\x02') {
    if ((long)container->cardinality == 0) goto LAB_0010dd9f;
    uVar4 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
  }
  else {
    uVar4 = bitset_container_maximum(container);
  }
  if (uVar4 < val) goto LAB_0010de91;
  if (typecode == '\x03') {
    lVar5 = *(long *)((long)c + 8);
    iVar2 = *c;
    if (iVar2 < 1) {
LAB_0010de59:
      uVar7 = 0;
LAB_0010de5b:
      uVar6 = 0xffffffff;
      if ((int)uVar7 < iVar2) {
        uVar6 = uVar7;
      }
    }
    else {
      iVar8 = iVar2 + -1;
      uVar7 = 0;
      do {
        uVar6 = iVar8 + uVar7 >> 1;
        uVar1 = *(ushort *)(lVar5 + (ulong)uVar6 * 4);
        if (uVar1 < val) {
          uVar7 = uVar6 + 1;
        }
        else {
          if (uVar1 <= val) goto LAB_0010de65;
          iVar8 = uVar6 - 1;
        }
      } while ((int)uVar7 <= iVar8);
      if (uVar7 == 0) goto LAB_0010de59;
      uVar6 = uVar7 - 1;
      if ((int)(uint)*(ushort *)(lVar5 + 2 + (ulong)uVar6 * 4) <
          (int)((uint)val - (uint)*(ushort *)(lVar5 + (ulong)uVar6 * 4))) goto LAB_0010de5b;
    }
LAB_0010de65:
    it->index = uVar6;
    uVar1 = *(ushort *)(lVar5 + (long)(int)uVar6 * 4);
    uVar7 = (uint)uVar1;
    if (uVar1 <= val) {
      uVar7 = (uint)val;
    }
  }
  else if (typecode == '\x02') {
    lVar5 = *(long *)((long)c + 8);
    iVar2 = *c;
    if (iVar2 < 1) {
      uVar7 = 0;
    }
    else {
      iVar8 = iVar2 + -1;
      uVar7 = 0;
      do {
        uVar6 = iVar8 + uVar7 >> 1;
        uVar1 = *(ushort *)(lVar5 + (ulong)(iVar8 + uVar7 & 0xfffffffe));
        if (uVar1 < val) {
          uVar7 = uVar6 + 1;
        }
        else {
          if (uVar1 <= val) goto LAB_0010de83;
          iVar8 = uVar6 - 1;
        }
      } while ((int)uVar7 <= iVar8);
    }
    uVar6 = 0xffffffff;
    if ((int)uVar7 < iVar2) {
      uVar6 = uVar7;
    }
LAB_0010de83:
    it->index = uVar6;
    uVar7 = (uint)*(ushort *)(lVar5 + (long)(int)uVar6 * 2);
  }
  else {
    uVar7 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
    it->index = uVar7;
  }
  *value_out = (uint16_t)uVar7;
LAB_0010de91:
  return val <= uVar4;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}